

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O2

vector<float,_std::allocator<float>_> *
CreateRandomPoint(vector<float,_std::allocator<float>_> *__return_storage_ptr__,int N)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  undefined1 local_13d0 [8];
  random_device rd;
  uniform_real_distribution<float> uniform_distribution;
  default_random_engine generator;
  numType x;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::random_device::random_device((random_device *)local_13d0);
  uVar1 = std::random_device::_M_getval();
  iVar2 = (int)((uVar1 & 0xffffffff) % 0x7fffffff);
  uniform_distribution._M_param._M_a = iVar2 + (uint)(iVar2 == 0);
  uniform_distribution._M_param._M_b = 0.0;
  rd.field_0._4992_8_ = 0x4120000000000000;
  iVar2 = 0;
  if (0 < N) {
    iVar2 = N;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    generator._M_x._4_4_ =
         std::uniform_real_distribution<float>::operator()
                   ((uniform_real_distribution<float> *)((long)&rd.field_0 + 0x1380),
                    (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                    &uniform_distribution);
    std::vector<float,_std::allocator<float>_>::push_back
              (__return_storage_ptr__,(value_type_conflict *)((long)&generator._M_x + 4));
  }
  std::random_device::~random_device((random_device *)local_13d0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<numType> CreateRandomPoint(const int N)
{
	    numType x;
		std::vector<numType> point;
    
	    //uniformly generate points
	    std::random_device rd;
	    std::default_random_engine generator( rd() );
	    std::uniform_real_distribution< numType > uniform_distribution(0, 10);
    	
		for( auto i=0; i < N; i++)
		{
	        x = uniform_distribution( generator );
	        point.push_back( x );
	    }
		
		return point;
}